

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void unlockPointer(_GLFWwindow *window)

{
  _GLFWwindow *window_local;
  
  zwp_relative_pointer_v1_destroy((window->wl).relativePointer);
  (window->wl).relativePointer = (zwp_relative_pointer_v1 *)0x0;
  zwp_locked_pointer_v1_destroy((window->wl).lockedPointer);
  (window->wl).lockedPointer = (zwp_locked_pointer_v1 *)0x0;
  return;
}

Assistant:

static void unlockPointer(_GLFWwindow* window)
{
    zwp_relative_pointer_v1_destroy(window->wl.relativePointer);
    window->wl.relativePointer = NULL;

    zwp_locked_pointer_v1_destroy(window->wl.lockedPointer);
    window->wl.lockedPointer = NULL;
}